

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<int,_QString>::emplace_helper<QString>
          (iterator *__return_storage_ptr__,QMultiHash<int,_QString> *this,int *key,QString *args)

{
  byte bVar1;
  Entry *pEVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 *puVar9;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::findOrInsert<int>
            ((InsertionResult *)local_58,this->d,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    puVar9 = (undefined4 *)operator_new(0x20);
    uVar5 = *(undefined4 *)&(args->d).d;
    uVar6 = *(undefined4 *)((long)&(args->d).d + 4);
    uVar7 = *(undefined4 *)&(args->d).ptr;
    uVar8 = *(undefined4 *)((long)&(args->d).ptr + 4);
    (args->d).d = (Data *)0x0;
    (args->d).ptr = (char16_t *)0x0;
    *puVar9 = uVar5;
    puVar9[1] = uVar6;
    puVar9[2] = uVar7;
    puVar9[3] = uVar8;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    *(qsizetype *)(puVar9 + 4) = qVar3;
    *(undefined8 *)(puVar9 + 6) = 0;
    *(int *)pEVar2[bVar1].storage.data = *key;
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar9;
  }
  else {
    puVar9 = (undefined4 *)operator_new(0x20);
    uVar5 = *(undefined4 *)&(args->d).d;
    uVar6 = *(undefined4 *)((long)&(args->d).d + 4);
    uVar7 = *(undefined4 *)&(args->d).ptr;
    uVar8 = *(undefined4 *)((long)&(args->d).ptr + 4);
    (args->d).d = (Data *)0x0;
    (args->d).ptr = (char16_t *)0x0;
    *puVar9 = uVar5;
    puVar9[1] = uVar6;
    puVar9[2] = uVar7;
    puVar9[3] = uVar8;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    *(qsizetype *)(puVar9 + 4) = qVar3;
    uVar4 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar9;
    *(undefined8 *)(puVar9 + 6) = uVar4;
  }
  this->m_size = this->m_size + 1;
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<int,_QString>_> *)local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }